

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBoxShape.cpp
# Opt level: O3

void __thiscall chrono::ChBoxShape::ArchiveIN(ChBoxShape *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::geometry::ChBox> specFuncA;
  undefined **local_38;
  ChBox *local_30;
  char *local_28;
  undefined1 *local_20;
  undefined1 local_18;
  
  ChArchiveIn::VersionRead<chrono::ChBoxShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_30 = &this->gbox;
  local_28 = "gbox";
  local_18 = 0;
  local_38 = &PTR__ChFunctorArchiveIn_00b40ab8;
  local_20 = (undefined1 *)&local_38;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  return;
}

Assistant:

void ChBoxShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChBoxShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(gbox);
}